

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  ArrayIndex AVar3;
  uint uVar4;
  Json *pJVar5;
  Value *pVVar6;
  PrecisionType precisionType;
  bool value_00;
  LargestInt value_01;
  LargestUInt value_02;
  char *pcVar7;
  undefined1 in_R8B;
  double value_03;
  String local_140;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  reference local_118;
  String *name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  iterator it;
  Members members;
  ArrayIndex index;
  ArrayIndex size;
  String local_c0;
  undefined1 local_99;
  int local_98;
  bool ok;
  char *end;
  char *str;
  String local_68;
  String local_38;
  Value *local_18;
  Value *value_local;
  FastWriter *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  VVar2 = Value::type(value);
  precisionType = 0x17c8bc;
  switch(VVar2) {
  case nullValue:
    if ((this->dropNullPlaceholders_ & 1U) == 0) {
      std::__cxx11::string::operator+=((string *)&this->document_,"null");
    }
    break;
  case intValue:
    pJVar5 = (Json *)Value::asLargestInt(local_18);
    valueToString_abi_cxx11_(&local_38,pJVar5,value_01);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case uintValue:
    pJVar5 = (Json *)Value::asLargestUInt(local_18);
    valueToString_abi_cxx11_(&local_68,pJVar5,value_02);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case realValue:
    value_03 = Value::asDouble(local_18);
    valueToString_abi_cxx11_((String *)&str,(Json *)0x11,value_03,0,precisionType);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    break;
  case stringValue:
    local_99 = Value::getString(local_18,&end,(char **)&local_98);
    if ((bool)local_99) {
      valueToQuotedStringN_abi_cxx11_
                (&local_c0,(Json *)end,(char *)(ulong)(uint)(local_98 - (int)end),0,(bool)in_R8B);
      std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    break;
  case booleanValue:
    bVar1 = Value::asBool(local_18);
    valueToString_abi_cxx11_((String *)&index,(Json *)(ulong)bVar1,value_00);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&index);
    std::__cxx11::string::~string((string *)&index);
    break;
  case arrayValue:
    std::__cxx11::string::operator+=((string *)&this->document_,'[');
    AVar3 = Value::size(local_18);
    for (members.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)members.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage < AVar3;
        members.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)members.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      if ((uint)members.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
        std::__cxx11::string::operator+=((string *)&this->document_,',');
      }
      pVVar6 = Value::operator[](local_18,(uint)members.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      writeValue(this,pVVar6);
    }
    std::__cxx11::string::operator+=((string *)&this->document_,']');
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)&it,local_18);
    std::__cxx11::string::operator+=((string *)&this->document_,'{');
    local_108._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&it);
    while( true ) {
      name = (String *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
      bVar1 = __gnu_cxx::operator!=
                        (&local_108,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&name);
      if (!bVar1) break;
      local_118 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_108);
      local_120._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
      bVar1 = __gnu_cxx::operator!=(&local_108,&local_120);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&this->document_,',');
      }
      pJVar5 = (Json *)std::__cxx11::string::data();
      uVar4 = std::__cxx11::string::length();
      valueToQuotedStringN_abi_cxx11_(&local_140,pJVar5,(char *)(ulong)uVar4,0,(bool)in_R8B);
      std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      pcVar7 = ":";
      if ((this->yamlCompatibilityEnabled_ & 1U) != 0) {
        pcVar7 = ": ";
      }
      std::__cxx11::string::operator+=((string *)&this->document_,pcVar7);
      pVVar6 = Value::operator[](local_18,local_118);
      writeValue(this,pVVar6);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_108);
    }
    std::__cxx11::string::operator+=((string *)&this->document_,'}');
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&it);
  }
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      document_ += valueToQuotedStringN(str, static_cast<unsigned>(end - str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    ArrayIndex size = value.size();
    for (ArrayIndex index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (auto it = members.begin(); it != members.end(); ++it) {
      const String& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(),
                                        static_cast<unsigned>(name.length()));
      document_ += yamlCompatibilityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}